

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tests.cpp
# Opt level: O0

void (anonymous_namespace)::sfinae_tester<____C_A_T_C_H____T_E_S_T____226()::local>(local *t)

{
  local *t_local;
  
  sfinae_tester_impl<____C_A_T_C_H____T_E_S_T____226()::local>(t,0);
  return;
}

Assistant:

void sfinae_tester(T&& t)
  {
    sfinae_tester_impl(std::forward<T>(t), tag_prefered_overload{}); /* the
    overload with the exact type match for the second argument is a closer
    match overall, so it will be tried first; if make_scope_guard is
    SFINAE-friendly, the other one is used as a fall-back when substitution
    fails on the former; otherwise, a compilation error is issued upon the
    substitution failure */
  }